

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer psVar1;
  XmlWriter *this_01;
  undefined8 this_02;
  int iVar2;
  tm *__tp;
  undefined4 extraout_var;
  _anonymous_namespace_ *this_03;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  pointer psVar3;
  long in_FS_OFFSET;
  time_t rawtime;
  ScopedElement e;
  size_type __dnew;
  char timeStamp [21];
  undefined1 local_f0 [24];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0._16_8_ = suiteTime;
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"testsuite","");
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00,(XmlFormatting)&local_58);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"name","");
  XmlWriter::writeAttribute(this_00,(string *)&local_58,&(groupNode->value).groupInfo.name);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"errors","");
  XmlWriter::writeAttribute<unsigned_int>(this_00,(string *)&local_58,&this->unexpectedExceptions);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"failures","");
  local_78._M_allocated_capacity =
       (groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions;
  XmlWriter::writeAttribute<unsigned_long>
            (this_00,(string *)&local_58,&local_78._M_allocated_capacity);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tests","");
  local_78._M_allocated_capacity =
       (groupNode->value).totals.assertions.failed + (groupNode->value).totals.assertions.passed +
       (groupNode->value).totals.assertions.failedButOk;
  XmlWriter::writeAttribute<unsigned_long>
            (this_00,(string *)&local_58,&local_78._M_allocated_capacity);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"hostname","");
  XmlWriter::writeAttribute<char[4]>(this_00,(string *)&local_58,(char (*) [4])"tbd");
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    local_58._M_allocated_capacity = (size_type)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time","");
    XmlWriter::writeAttribute<char[1]>(this_00,(string *)&local_58,(char (*) [1])0x1ab288);
  }
  else {
    this_03 = (_anonymous_namespace_ *)0x1a8e23;
    local_58._M_allocated_capacity = (size_type)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"time","");
    (anonymous_namespace)::formatDuration_abi_cxx11_
              ((string *)&local_78,this_03,(double)local_f0._16_8_);
    XmlWriter::writeAttribute(this_00,(string *)&local_58,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity);
    }
  }
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"timestamp","");
  time((time_t *)local_d8);
  __tp = gmtime((time_t *)local_d8);
  strftime(local_98._M_local_buf,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  local_b8._0_8_ = (XmlWriter *)0x14;
  local_78._M_allocated_capacity = (size_type)&local_68;
  local_78._M_allocated_capacity =
       std::__cxx11::string::_M_create(&local_78._M_allocated_capacity,(ulong)local_b8);
  local_68._M_allocated_capacity = local_b8._0_8_;
  *(undefined4 *)(local_78._M_allocated_capacity + 0x10) = local_88._M_allocated_capacity._0_4_;
  *(size_type *)local_78._M_allocated_capacity = local_98._M_allocated_capacity;
  *(undefined8 *)(local_78._M_allocated_capacity + 8) = local_98._8_8_;
  local_78._8_8_ = local_b8._0_8_;
  *(char *)(local_78._M_allocated_capacity + local_b8._0_8_) = '\0';
  XmlWriter::writeAttribute(this_00,(string *)&local_58,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_00172a13;
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"properties","");
  XmlWriter::scopedElement((XmlWriter *)local_d8,(string *)this_00,(XmlFormatting)&local_58);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 != '\0') {
    local_58._M_allocated_capacity = (size_type)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"property","");
    XmlWriter::scopedElement((XmlWriter *)local_f0,(string *)this_00,(XmlFormatting)&local_58);
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
    this_01 = (XmlWriter *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
    XmlWriter::writeAttribute<char[8]>(this_01,(string *)&local_78,(char (*) [8])"filters");
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"value","");
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)local_b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    XmlWriter::writeAttribute(this_01,(string *)&local_98,(string *)local_b8);
    if ((XmlWriter *)local_b8._0_8_ != (XmlWriter *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
    if ((char *)local_58._M_allocated_capacity != local_48) {
      operator_delete((void *)local_58._M_allocated_capacity);
    }
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    local_58._M_allocated_capacity = (size_type)local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"property","");
    XmlWriter::scopedElement((XmlWriter *)local_b8,(string *)this_00,(XmlFormatting)&local_58);
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
    this_02 = local_b8._0_8_;
    XmlWriter::writeAttribute<char[12]>
              ((XmlWriter *)local_b8._0_8_,(string *)&local_78,(char (*) [12])"random-seed");
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"value","");
    local_f0._0_4_ =
         (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)this_02,(string *)&local_98,(uint *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b8);
    if ((char *)local_58._M_allocated_capacity != local_48) {
      operator_delete((void *)local_58._M_allocated_capacity);
    }
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_d8);
LAB_00172a13:
  psVar1 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (groupNode->children).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    writeTestCase(this,(psVar3->
                       super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"system-out","");
  XmlWriter::scopedElement((XmlWriter *)&local_98,(string *)this_00,(XmlFormatting)&local_58);
  trim((string *)&local_78,&this->stdOutForSuite);
  XmlWriter::writeText((XmlWriter *)local_98._M_allocated_capacity,(string *)&local_78,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_98);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"system-err","");
  XmlWriter::scopedElement((XmlWriter *)&local_98,(string *)this_00,(XmlFormatting)&local_58);
  trim((string *)&local_78,&this->stdErrForSuite);
  XmlWriter::writeText((XmlWriter *)local_98._M_allocated_capacity,(string *)&local_78,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_98);
  if ((char *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }